

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffhdr2str(fitsfile *fptr,int exclude_comm,char **exclist,int nexc,char **header,int *nkeys,
             int *status)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  int totkeys;
  char *local_158;
  int local_150;
  int match;
  int *local_148;
  char **local_140;
  long local_138;
  int exact;
  char keyname [75];
  char keybuf [162];
  
  *nkeys = 0;
  iVar3 = *status;
  if (iVar3 < 1) {
    iVar2 = ffghsp(fptr,&totkeys,(int *)0x0,status);
    iVar3 = totkeys;
    if (iVar2 < 1) {
      local_150 = exclude_comm;
      local_158 = (char *)calloc((long)(totkeys * 0x50 + 0x51),1);
      *header = local_158;
      if (local_158 == (char *)0x0) {
        *status = 0x71;
        ffpmsg("failed to allocate memory to hold all the header keywords");
      }
      else {
        local_138 = (long)nexc;
        lVar9 = 0;
        if (0 < local_138) {
          lVar9 = local_138;
        }
        local_148 = nkeys;
        local_140 = header;
        for (lVar7 = 1; pcVar8 = local_158, lVar7 <= iVar3; lVar7 = lVar7 + 1) {
          ffgrec(fptr,(int)lVar7,keybuf,status);
          sVar4 = strlen(keybuf);
          memcpy(keybuf + sVar4,
                 "                                                                                ",
                 0x51);
          keyname[0] = '\0';
          strncat(keyname,keybuf,8);
          if (local_150 == 0) {
LAB_001ac58a:
            lVar5 = 0;
            while ((lVar6 = lVar9, lVar9 != lVar5 &&
                   (ffcmps(exclist[lVar5],keyname,0,&match,&exact), lVar6 = lVar5, match == 0))) {
              lVar5 = lVar5 + 1;
            }
            pcVar8 = local_158;
            if (lVar6 == local_138) {
              strcpy(local_158,keybuf);
              local_158 = pcVar8 + 0x50;
              *local_148 = *local_148 + 1;
            }
          }
          else {
            if (keyname[0] == ' ') {
              pcVar8 = "        ";
            }
            else if (keyname[0] == 'H') {
              pcVar8 = "HISTORY ";
            }
            else {
              if (keyname[0] != 'C') goto LAB_001ac58a;
              pcVar8 = "COMMENT ";
            }
            iVar3 = bcmp(pcVar8,keyname,9);
            if (iVar3 != 0) goto LAB_001ac58a;
          }
          iVar3 = totkeys;
        }
        memcpy(local_158,
               "END                                                                             ",
               0x51);
        ppcVar1 = local_140;
        *local_148 = *local_148 + 1;
        pcVar8[0x50] = '\0';
        pcVar8 = (char *)realloc(*local_140,(long)*local_148 * 0x50 + 1);
        *ppcVar1 = pcVar8;
      }
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffhdr2str( fitsfile *fptr,  /* I - FITS file pointer                    */
            int exclude_comm,   /* I - if TRUE, exclude commentary keywords */
            char **exclist,     /* I - list of excluded keyword names       */
            int nexc,           /* I - number of names in exclist           */
            char **header,      /* O - returned header string               */
            int *nkeys,         /* O - returned number of 80-char keywords  */
            int  *status)       /* IO - error status                        */
/*
  read header keywords into a long string of chars.  This routine allocates
  memory for the string, so the calling routine must eventually free the
  memory when it is not needed any more.  If exclude_comm is TRUE, then all 
  the COMMENT, HISTORY, and <blank> keywords will be excluded from the output
  string of keywords.  Any other list of keywords to be excluded may be
  specified with the exclist parameter.
*/
{
    int casesn, match, exact, totkeys;
    long ii, jj;
    char keybuf[162], keyname[FLEN_KEYWORD], *headptr;

    *nkeys = 0;

    if (*status > 0)
        return(*status);

    /* get number of keywords in the header (doesn't include END) */
    if (ffghsp(fptr, &totkeys, NULL, status) > 0)
        return(*status);

    /* allocate memory for all the keywords */
    /* (will reallocate it later to minimize the memory size) */
    
    *header = (char *) calloc ( (totkeys + 1) * 80 + 1, 1);
    if (!(*header))
    {
         *status = MEMORY_ALLOCATION;
         ffpmsg("failed to allocate memory to hold all the header keywords");
         return(*status);
    }

    headptr = *header;
    casesn = FALSE;

    /* read every keyword */
    for (ii = 1; ii <= totkeys; ii++) 
    {
        ffgrec(fptr, ii, keybuf, status);
        /* pad record with blanks so that it is at least 80 chars long */
        strcat(keybuf,
    "                                                                                ");

        keyname[0] = '\0';
        strncat(keyname, keybuf, 8); /* copy the keyword name */
        
        if (exclude_comm)
        {
            if (!FSTRCMP("COMMENT ", keyname) ||
                !FSTRCMP("HISTORY ", keyname) ||
                !FSTRCMP("        ", keyname) )
              continue;  /* skip this commentary keyword */
        }

        /* does keyword match any names in the exclusion list? */
        for (jj = 0; jj < nexc; jj++ )
        {
            ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                 if (match)
                     break;
        }

        if (jj == nexc)
        {
            /* not in exclusion list, add this keyword to the string */
            strcpy(headptr, keybuf);
            headptr += 80;
            (*nkeys)++;
        }
    }

    /* add the END keyword */
    strcpy(headptr,
    "END                                                                             ");
    headptr += 80;
    (*nkeys)++;

    *headptr = '\0';   /* terminate the header string */
    /* minimize the allocated memory */
    *header = (char *) realloc(*header, (*nkeys *80) + 1);  

    return(*status);
}